

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZukerAlgorithm.h
# Opt level: O0

int __thiscall
ZukerAlgorithm::interior_loop
          (ZukerAlgorithm *this,int i,int j,int h,int k,int i1,int j1,int h1,int k1,int n1,int n2)

{
  double dVar1;
  int *piVar2;
  reference pvVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int ns;
  int nl;
  int type2;
  int type;
  int energy;
  int local_54;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  local_2c = BP_pair[in_ESI + 1][in_EDX + 1];
  local_30 = rtype[BP_pair[in_ECX + 1][in_R8D + 1]];
  local_24 = in_R9D;
  piVar2 = std::max<int>(&stack0x00000020,&stack0x00000028);
  local_34 = *piVar2;
  piVar2 = std::min<int>(&stack0x00000020,&stack0x00000028);
  local_44 = internal_loop[0x1e];
  dVar1 = lxc;
  local_38 = *piVar2;
  if (local_38 == 1) {
    if (local_34 == 1) {
      return int11[local_2c][local_30][local_24 + 1][in_stack_00000008 + 1];
    }
    if (local_34 == 2) {
      if (in_stack_00000020 == 1) {
        local_28 = int21[local_2c][local_30][local_24 + 1][in_stack_00000018 + 1]
                   [in_stack_00000008 + 1];
      }
      else {
        local_28 = int21[local_30][local_2c][in_stack_00000018 + 1][local_24 + 1]
                   [in_stack_00000010 + 1];
      }
      return local_28;
    }
    if (local_34 + 1 < 0x1f) {
      local_44 = internal_loop[local_34 + 1];
    }
    else {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&Log,(long)(local_34 + 1));
      local_44 = local_44 + (int)(dVar1 * *pvVar3);
    }
    local_28 = local_44;
    local_3c = (local_34 - local_38) * ninio;
    piVar2 = std::min<int>(&MAX_NINIO,&local_3c);
    return mismatch1nI[local_2c][local_24 + 1][in_stack_00000008 + 1] +
           mismatch1nI[local_30][in_stack_00000018 + 1][in_stack_00000010 + 1] + *piVar2 + local_28;
  }
  if (local_38 == 2) {
    if (local_34 == 2) {
      return int22[local_2c][local_30][local_24 + 1][in_stack_00000010 + 1][in_stack_00000018 + 1]
             [in_stack_00000008 + 1];
    }
    if (local_34 == 3) {
      return mismatch23I[local_2c][local_24 + 1][in_stack_00000008 + 1] +
             mismatch23I[local_30][in_stack_00000018 + 1][in_stack_00000010 + 1] +
             internal_loop[5] + ninio;
    }
  }
  if (in_stack_00000020 + in_stack_00000028 < 0x1f) {
    local_54 = internal_loop[in_stack_00000020 + in_stack_00000028];
  }
  else {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&Log,(long)(in_stack_00000020 + in_stack_00000028));
    local_54 = local_44 + (int)(dVar1 * *pvVar3);
  }
  local_28 = local_54;
  local_40 = (local_34 - local_38) * ninio;
  piVar2 = std::min<int>(&MAX_NINIO,&local_40);
  return mismatchI[local_2c][local_24 + 1][in_stack_00000008 + 1] +
         mismatchI[local_30][in_stack_00000018 + 1][in_stack_00000010 + 1] + *piVar2 + local_28;
}

Assistant:

inline int ZukerAlgorithm::interior_loop(int i, int j, int h, int k, int i1, int j1, int h1, int k1, int n1, int n2) const {
    int energy;
    int type = BP_pair[i+1][j+1];
    int type2 = rtype[BP_pair[h+1][k+1]];
    int nl, ns;

    nl = max(n1, n2);
    ns = min(n1, n2);
    if (ns==1) {
        if (nl==1)                    /* 1x1 loop */
            return int11[type][type2][i1+1][j1+1];
        if (nl==2) {                  /* 2x1 loop */
            if (n1==1)
                energy = int21[type][type2][i1+1][k1+1][j1+1];
            else
                energy = int21[type2][type][k1+1][i1+1][h1+1];
            return energy;
        }
        else {  /* 1xn loop */
            energy = (nl+1<=MAXLOOP)?(internal_loop[nl+1]) : (internal_loop[30]+(int)(lxc*Log[nl+1]));
            energy += min(MAX_NINIO, (nl-ns)*ninio);
            energy += mismatch1nI[type][i1+1][j1+1] + mismatch1nI[type2][k1+1][h1+1];
            return energy;
        }
    }
    else if (ns==2) {
        if(nl==2)      {              /* 2x2 loop */
            return int22[type][type2][i1+1][h1+1][k1+1][j1+1];}
        else if (nl==3){              /* 2x3 loop */
            energy = internal_loop[5]+ninio;
            energy += mismatch23I[type][i1+1][j1+1] + mismatch23I[type2][k1+1][h1+1];
            return energy;
        }

    }
    { /* generic interior loop (no else here!)*/
        energy = (n1+n2<=MAXLOOP)?(internal_loop[n1+n2]) : (internal_loop[30]+(int)(lxc*Log[n1+n2]));
        energy += min(MAX_NINIO, (nl-ns)*ninio);

        energy += mismatchI[type][i1+1][j1+1] + mismatchI[type2][k1+1][h1+1];
    }
    return energy;
}